

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USS.h
# Opt level: O2

void __thiscall USS<4U>::USS(USS<4U> *this,uint32_t _SIZE)

{
  StreamSummary<4U> *this_00;
  
  Abstract<4U>::Abstract(&this->super_Abstract<4U>);
  (this->super_Abstract<4U>)._vptr_Abstract = (_func_int **)&PTR_Init_00113c40;
  std::__cxx11::string::assign((char *)&(this->super_Abstract<4U>).name);
  this_00 = (StreamSummary<4U> *)operator_new(0x48);
  StreamSummary<4U>::StreamSummary(this_00,_SIZE);
  this->summary = this_00;
  return;
}

Assistant:

USS(uint32_t _SIZE) {
		this->name = "USS";
		summary = new StreamSummary<DATA_LEN>(_SIZE);
	}